

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

bool AM_clearMarks(void)

{
  long lVar1;
  
  lVar1 = 0xa0;
  do {
    *(undefined8 *)((long)&scale_ftom + lVar1) = 0xbff0000000000000;
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0);
  markpointnum = 0;
  return 0 < marknums[0].texnum;
}

Assistant:

bool AM_clearMarks ()
{
	for (int i = AM_NUMMARKPOINTS-1; i >= 0; i--)
		markpoints[i].x = -1; // means empty
	markpointnum = 0;
	return marknums[0].isValid();
}